

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

int cmsys::SystemTools::GetTerminalWidth(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  string columns;
  char *endptr;
  winsize ws;
  string local_48;
  char *local_28;
  short local_20;
  ushort local_1e;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  iVar2 = ioctl(1,0x5413,&local_20);
  uVar5 = -(uint)(local_20 == 0) | (uint)local_1e | -(uint)(local_1e == 0);
  if (iVar2 == -1) {
    uVar5 = 0xffffffff;
  }
  iVar2 = isatty(1);
  bVar1 = GetEnv("COLUMNS",&local_48);
  uVar5 = -(uint)(iVar2 == 0) | uVar5;
  if (bVar1 && local_48._M_string_length != 0) {
    lVar3 = strtol(local_48._M_dataplus._M_p,&local_28,0);
    if (local_28 != (char *)0x0) {
      uVar4 = uVar5;
      if (lVar3 - 1U < 999) {
        uVar4 = (uint)lVar3;
      }
      if (*local_28 == '\0') {
        uVar5 = uVar4;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  uVar4 = 0xffffffff;
  if (8 < (int)uVar5) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

static time_t windows_filetime_to_posix_time(const FILETIME& ft)
{
  LARGE_INTEGER date;
  date.HighPart = ft.dwHighDateTime;
  date.LowPart = ft.dwLowDateTime;

  // removes the diff between 1970 and 1601
  date.QuadPart -= ((LONGLONG)(369 * 365 + 89) * 24 * 3600 * 10000000);

  // converts back from 100-nanoseconds to seconds
  return date.QuadPart / 10000000;
}